

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O3

void __thiscall bsplib::Rdma::ActionBuf::execute(ActionBuf *this,Rdma *rdma)

{
  int iVar1;
  uint uVar2;
  int pid;
  int __fd;
  long lVar3;
  unsigned_long x;
  long lVar4;
  unsigned_long uVar5;
  void *pvVar6;
  A2A *a2a;
  pointer pAVar7;
  long lVar8;
  void *__buf;
  ulong uVar9;
  Category c;
  unsigned_long in_R8;
  long lVar10;
  unsigned_long x_00;
  Time t;
  TicToc local_78;
  A2A *local_58;
  ActionBuf *local_50;
  timespec local_48;
  
  pAVar7 = (this->m_actions).
           super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_actions).
      super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>._M_impl.
      super__Vector_impl_data._M_finish != pAVar7) {
    lVar8 = (long)rdma->m_pid;
    local_58 = &rdma->m_second_exchange;
    lVar10 = 0x30;
    uVar9 = 0;
    local_50 = this;
    do {
      iVar1 = *(int *)((long)pAVar7 + lVar10 + -0x30);
      uVar2 = *(uint *)((long)pAVar7 + lVar10 + -0x28);
      pid = *(int *)((long)pAVar7 + lVar10 + -0x24);
      __buf = (void *)(long)pid;
      __fd = *(int *)((long)pAVar7 + lVar10 + -0x20);
      lVar3 = *(long *)((long)pAVar7 + lVar10 + -0x18);
      x = *(unsigned_long *)((long)pAVar7 + lVar10 + -0x10);
      lVar4 = *(long *)((long)pAVar7 + lVar10 + -8);
      x_00 = *(unsigned_long *)((long)&pAVar7->kind + lVar10);
      c = (iVar1 != 1) + HPPUT;
      if (iVar1 == 0) {
        c = GET;
      }
      local_78.m_record = TicToc::push(c);
      clock_gettime(1,&local_48);
      a2a = local_58;
      local_78.m_start.tv_sec = local_48.tv_sec;
      local_78.m_start.tv_nsec = local_48.tv_nsec;
      local_78.m_nbytes = 0;
      if (iVar1 == 2) {
        in_R8 = x_00;
        Unbuf::send(&rdma->m_unbuf,__fd,__buf,
                    lVar4 + (long)(rdma->m_used_slots).
                                  super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>
                                  ._M_impl.super__Vector_impl_data._M_start
                                  [lVar3 * rdma->m_nprocs + lVar8].addr,(int)x_00);
LAB_0010de01:
        local_78.m_nbytes = x_00 + local_78.m_nbytes;
      }
      else {
        if (iVar1 == 1) {
          in_R8 = x_00;
          Unbuf::recv(&rdma->m_unbuf,__fd,(void *)(ulong)uVar2,
                      lVar4 + (long)(rdma->m_used_slots).
                                    super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>
                                    ._M_impl.super__Vector_impl_data._M_start
                                    [x * (long)rdma->m_nprocs + lVar8].addr,(int)x_00);
          goto LAB_0010de01;
        }
        if (iVar1 == 0) {
          uVar5 = (rdma->m_second_exchange).m_send_sizes.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)__buf];
          pvVar6 = (rdma->m_used_slots).
                   super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar3 * rdma->m_nprocs + lVar8].addr;
          serial<unsigned_long>(local_58,pid,x_00);
          serial<unsigned_long>(a2a,pid,x);
          A2A::send(a2a,pid,(void *)(lVar4 + (long)pvVar6),x_00,(int)in_R8);
          x_00 = (rdma->m_second_exchange).m_send_sizes.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)__buf] - uVar5;
          goto LAB_0010de01;
        }
      }
      TicToc::~TicToc(&local_78);
      uVar9 = uVar9 + 1;
      pAVar7 = (local_50->m_actions).
               super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar10 = lVar10 + 0x38;
    } while (uVar9 < (ulong)(((long)(local_50->m_actions).
                                    super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar7 >> 3)
                            * 0x6db6db6db6db6db7));
  }
  return;
}

Assistant:

void Rdma::ActionBuf::execute( Rdma & rdma )
{
    const int pid = rdma.m_pid;
    for (size_t i = 0; i < m_actions.size(); ++i ) 
    {
        Action a = m_actions[i];
#ifdef PROFILE
        TicToc t( a.kind==Action::GET? TicToc::GET:
                  a.kind==Action::HPPUT? TicToc::HPPUT:
                  TicToc::HPGET );
#endif
        switch( a.kind ) {
            case Action::GET : {
#ifdef PROFILE
                size_t start=rdma.m_second_exchange.send_size(a.dst_pid);
#endif
                char * addr = static_cast< char *>( 
                        rdma.slot( pid, a.src_slot ).addr );
                addr += a.offset;
                serial( rdma.m_second_exchange, a.dst_pid, a.size );
                serial( rdma.m_second_exchange, a.dst_pid, a.dst_slot );
                rdma.m_second_exchange.send( a.dst_pid, addr, a.size );
#ifdef PROFILE
                size_t end=rdma.m_second_exchange.send_size(a.dst_pid);
                t.add_bytes(end-start);
#endif
                break;
            }

            case Action::HPPUT : {
                char * addr = static_cast< char *>(
                        rdma.slot( pid, a.dst_slot ).addr );
                addr += a.offset;
                rdma.m_unbuf.recv( a.tag, a.src_pid, addr, a.size );
#ifdef PROFILE
                t.add_bytes(a.size);
#endif
                break;
            }

            case Action::HPGET : {
                char * addr = static_cast< char *>(
                        rdma.slot( pid, a.src_slot ).addr );
                addr += a.offset;
                rdma.m_unbuf.send( a.tag, a.dst_pid, addr, a.size );
#ifdef PROFILE
                t.add_bytes(a.size);
#endif
                break;
            }
        }
    }
}